

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O1

void __thiscall
sglr::ReferenceContext::texStorage3D
          (ReferenceContext *this,deUint32 target,int levels,deUint32 internalFormat,int width,
          int height,int depth)

{
  pointer pTVar1;
  uint uVar2;
  byte bVar3;
  uint uVar4;
  int depth_00;
  int level_2;
  int level;
  int iVar5;
  Texture2DArray *pTVar6;
  TextureCubeArray *pTVar7;
  Texture3D *pTVar8;
  TextureFormat storageFmt;
  TextureFormat local_38;
  
  iVar5 = this->m_activeTexture;
  pTVar1 = (this->m_textureUnits).
           super__Vector_base<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_38.order = CHANNELORDER_LAST;
  local_38.type = CHANNELTYPE_LAST;
  if (0 < width && 0 < height) {
    uVar2 = height;
    if (height < width) {
      uVar2 = width;
    }
    uVar4 = 0x20;
    if (uVar2 != 0) {
      uVar4 = 0x1f;
      if (uVar2 != 0) {
        for (; uVar2 >> uVar4 == 0; uVar4 = uVar4 - 1) {
        }
      }
      uVar4 = uVar4 ^ 0x1f;
    }
    if ((0 < levels) && (levels <= (int)(0x20 - uVar4))) {
      local_38 = mapInternalFormat(internalFormat);
      if ((local_38.order == CHANNELORDER_LAST) || (local_38.type == CHANNELTYPE_LAST)) {
LAB_004e3eaf:
        if (this->m_lastError != 0) {
          return;
        }
        this->m_lastError = 0x500;
        return;
      }
      if (target == 0x806f) {
        pTVar8 = &pTVar1[iVar5].default3DTex;
        if (pTVar1[iVar5].tex3DBinding != (Texture3D *)0x0) {
          pTVar8 = pTVar1[iVar5].tex3DBinding;
        }
        iVar5 = (this->m_limits).maxTexture3DSize;
        if (((depth <= iVar5) && (width <= iVar5)) && (height <= iVar5)) {
          if ((pTVar8->super_Texture).m_immutable != true) {
            rc::TextureLevelArray::clear(&pTVar8->m_levels);
            (pTVar8->super_Texture).m_immutable = true;
            iVar5 = 0;
            do {
              bVar3 = (byte)iVar5;
              uVar2 = (uint)width >> (bVar3 & 0x1f);
              if ((int)uVar2 < 2) {
                uVar2 = 1;
              }
              uVar4 = (uint)height >> (bVar3 & 0x1f);
              if ((int)uVar4 < 2) {
                uVar4 = 1;
              }
              depth_00 = depth >> (bVar3 & 0x1f);
              if (depth_00 < 2) {
                depth_00 = 1;
              }
              rc::TextureLevelArray::allocLevel
                        (&pTVar8->m_levels,iVar5,&local_38,uVar2,uVar4,depth_00);
              iVar5 = iVar5 + 1;
            } while (levels != iVar5);
            return;
          }
LAB_004e3fc2:
          if (this->m_lastError != 0) {
            return;
          }
          this->m_lastError = 0x502;
          return;
        }
      }
      else if (target == 0x9009) {
        pTVar7 = &pTVar1[iVar5].defaultCubeArrayTex;
        if (pTVar1[iVar5].texCubeArrayBinding != (TextureCubeArray *)0x0) {
          pTVar7 = pTVar1[iVar5].texCubeArrayBinding;
        }
        if (((width == height) && (depth % 6 == 0)) &&
           ((width <= (this->m_limits).maxTexture2DSize &&
            (depth < (this->m_limits).maxTexture2DArrayLayers)))) {
          if ((pTVar7->super_Texture).m_immutable != true) {
            rc::TextureLevelArray::clear(&pTVar7->m_levels);
            (pTVar7->super_Texture).m_immutable = true;
            iVar5 = 0;
            do {
              uVar2 = (uint)width >> ((byte)iVar5 & 0x1f);
              if ((int)uVar2 < 2) {
                uVar2 = 1;
              }
              uVar4 = (uint)height >> ((byte)iVar5 & 0x1f);
              if ((int)uVar4 < 2) {
                uVar4 = 1;
              }
              rc::TextureLevelArray::allocLevel(&pTVar7->m_levels,iVar5,&local_38,uVar2,uVar4,depth)
              ;
              iVar5 = iVar5 + 1;
            } while (levels != iVar5);
            return;
          }
          goto LAB_004e3fc2;
        }
      }
      else {
        if (target != 0x8c1a) goto LAB_004e3eaf;
        pTVar6 = &pTVar1[iVar5].default2DArrayTex;
        if (pTVar1[iVar5].tex2DArrayBinding != (Texture2DArray *)0x0) {
          pTVar6 = pTVar1[iVar5].tex2DArrayBinding;
        }
        iVar5 = (this->m_limits).maxTexture2DSize;
        if (((width <= iVar5) && (height < iVar5)) &&
           (depth < (this->m_limits).maxTexture2DArrayLayers)) {
          if ((pTVar6->super_Texture).m_immutable != true) {
            rc::TextureLevelArray::clear(&pTVar6->m_levels);
            (pTVar6->super_Texture).m_immutable = true;
            iVar5 = 0;
            do {
              uVar2 = (uint)width >> ((byte)iVar5 & 0x1f);
              if ((int)uVar2 < 2) {
                uVar2 = 1;
              }
              uVar4 = (uint)height >> ((byte)iVar5 & 0x1f);
              if ((int)uVar4 < 2) {
                uVar4 = 1;
              }
              rc::TextureLevelArray::allocLevel(&pTVar6->m_levels,iVar5,&local_38,uVar2,uVar4,depth)
              ;
              iVar5 = iVar5 + 1;
            } while (levels != iVar5);
            return;
          }
          goto LAB_004e3fc2;
        }
      }
    }
  }
  if (this->m_lastError == 0) {
    this->m_lastError = 0x501;
  }
  return;
}

Assistant:

void ReferenceContext::texStorage3D (deUint32 target, int levels, deUint32 internalFormat, int width, int height, int depth)
{
	TextureUnit&		unit		= m_textureUnits[m_activeTexture];
	TextureFormat		storageFmt;

	RC_IF_ERROR(width <= 0 || height <= 0, GL_INVALID_VALUE, RC_RET_VOID);
	RC_IF_ERROR(!de::inRange(levels, 1, (int)deLog2Floor32(de::max(width, height))+1), GL_INVALID_VALUE, RC_RET_VOID);

	// Map storage format.
	storageFmt = mapInternalFormat(internalFormat);
	RC_IF_ERROR(storageFmt.order	== TextureFormat::CHANNELORDER_LAST ||
				storageFmt.type		== TextureFormat::CHANNELTYPE_LAST, GL_INVALID_ENUM, RC_RET_VOID);

	if (target == GL_TEXTURE_2D_ARRAY)
	{
		Texture2DArray& texture = unit.tex2DArrayBinding ? *unit.tex2DArrayBinding : unit.default2DArrayTex;

		RC_IF_ERROR(width	>	m_limits.maxTexture2DSize	||
					height	>=	m_limits.maxTexture2DSize	||
					depth	>=	m_limits.maxTexture2DArrayLayers, GL_INVALID_VALUE, RC_RET_VOID);
		RC_IF_ERROR(texture.isImmutable(), GL_INVALID_OPERATION, RC_RET_VOID);

		texture.clearLevels();
		texture.setImmutable();

		for (int level = 0; level < levels; level++)
		{
			int levelW = de::max(1, width >> level);
			int levelH = de::max(1, height >> level);

			texture.allocLevel(level, storageFmt, levelW, levelH, depth);
		}
	}
	else if (target == GL_TEXTURE_3D)
	{
		Texture3D& texture = unit.tex3DBinding ? *unit.tex3DBinding : unit.default3DTex;

		RC_IF_ERROR(width	> m_limits.maxTexture3DSize	||
					height	> m_limits.maxTexture3DSize	||
					depth	> m_limits.maxTexture3DSize, GL_INVALID_VALUE, RC_RET_VOID);
		RC_IF_ERROR(texture.isImmutable(), GL_INVALID_OPERATION, RC_RET_VOID);

		texture.clearLevels();
		texture.setImmutable();

		for (int level = 0; level < levels; level++)
		{
			int levelW = de::max(1, width		>> level);
			int levelH = de::max(1, height	>> level);
			int levelD = de::max(1, depth		>> level);

			texture.allocLevel(level, storageFmt, levelW, levelH, levelD);
		}
	}
	else if (target == GL_TEXTURE_CUBE_MAP_ARRAY)
	{
		TextureCubeArray& texture = unit.texCubeArrayBinding ? *unit.texCubeArrayBinding : unit.defaultCubeArrayTex;

		RC_IF_ERROR(width		!=	height								||
					depth % 6	!= 0									||
					width		>	m_limits.maxTexture2DSize			||
					depth		>=	m_limits.maxTexture2DArrayLayers, GL_INVALID_VALUE, RC_RET_VOID);
		RC_IF_ERROR(texture.isImmutable(), GL_INVALID_OPERATION, RC_RET_VOID);

		texture.clearLevels();
		texture.setImmutable();

		for (int level = 0; level < levels; level++)
		{
			int levelW = de::max(1, width >> level);
			int levelH = de::max(1, height >> level);

			texture.allocLevel(level, storageFmt, levelW, levelH, depth);
		}
	}
	else
		RC_ERROR_RET(GL_INVALID_ENUM, RC_RET_VOID);
}